

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ConsumerPortProxy::GetTraceStats
          (ConsumerPortProxy *this,GetTraceStatsRequest *request,
          DeferredGetTraceStatsResponse *reply,int fd)

{
  DeferredGetTraceStatsResponse *request_00;
  Deferred<perfetto::protos::gen::GetTraceStatsResponse> local_a0;
  DeferredBase local_80;
  allocator<char> local_49;
  string local_48;
  int local_24;
  DeferredGetTraceStatsResponse *pDStack_20;
  int fd_local;
  DeferredGetTraceStatsResponse *reply_local;
  GetTraceStatsRequest *request_local;
  ConsumerPortProxy *this_local;
  
  local_24 = fd;
  pDStack_20 = reply;
  reply_local = (DeferredGetTraceStatsResponse *)request;
  request_local = (GetTraceStatsRequest *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GetTraceStats",&local_49);
  request_00 = reply_local;
  ipc::Deferred<perfetto::protos::gen::GetTraceStatsResponse>::Deferred(&local_a0,reply);
  ipc::DeferredBase::DeferredBase<perfetto::protos::gen::GetTraceStatsResponse>(&local_80,&local_a0)
  ;
  ipc::ServiceProxy::BeginInvoke
            (&this->super_ServiceProxy,&local_48,(ProtoMessage *)request_00,&local_80,local_24);
  ipc::DeferredBase::~DeferredBase(&local_80);
  ipc::Deferred<perfetto::protos::gen::GetTraceStatsResponse>::~Deferred(&local_a0);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void ConsumerPortProxy::GetTraceStats(const GetTraceStatsRequest& request, DeferredGetTraceStatsResponse reply, int fd) {
  BeginInvoke("GetTraceStats", request, ::perfetto::ipc::DeferredBase(std::move(reply)),
              fd);
}